

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCVS.cxx
# Opt level: O3

string * __thiscall
cmCTestCVS::ComputeBranchFlag(string *__return_storage_ptr__,cmCTestCVS *this,string *dir)

{
  pointer pcVar1;
  bool bVar2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string tagFile;
  string tagLine;
  ifstream tagStream;
  long *local_280 [2];
  long local_270 [2];
  string local_260;
  basic_string_view<char,_std::char_traits<char>_> local_240;
  long local_230;
  char *local_228;
  long local_220 [4];
  byte abStack_200 [488];
  
  pcVar1 = (this->super_cmCTestVC).SourceDirectory._M_dataplus._M_p;
  local_280[0] = local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_280,pcVar1,
             pcVar1 + (this->super_cmCTestVC).SourceDirectory._M_string_length);
  if (dir->_M_string_length != 0) {
    std::__cxx11::string::append((char *)local_280);
    std::__cxx11::string::_M_append((char *)local_280,(ulong)(dir->_M_dataplus)._M_p);
  }
  std::__cxx11::string::append((char *)local_280);
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::ifstream::ifstream(local_220,(char *)local_280[0],_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)local_220,&local_260,(bool *)0x0,0xffffffffffffffff);
    if (((bVar2) && (1 < local_260._M_string_length)) && (*local_260._M_dataplus._M_p == 'T')) {
      local_230 = local_260._M_string_length - 1;
      local_228 = local_260._M_dataplus._M_p + 1;
      local_240._M_len = 2;
      local_240._M_str = "-r";
      views._M_len = 2;
      views._M_array = &local_240;
      cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
      goto LAB_0059f453;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"-b","");
LAB_0059f453:
  std::ifstream::~ifstream(local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if (local_280[0] != local_270) {
    operator_delete(local_280[0],local_270[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestCVS::ComputeBranchFlag(std::string const& dir)
{
  // Compute the tag file location for this directory.
  std::string tagFile = this->SourceDirectory;
  if (!dir.empty()) {
    tagFile += "/";
    tagFile += dir;
  }
  tagFile += "/CVS/Tag";

  // Lookup the branch in the tag file, if any.
  std::string tagLine;
  cmsys::ifstream tagStream(tagFile.c_str());
  if (tagStream && cmSystemTools::GetLineFromStream(tagStream, tagLine) &&
      tagLine.size() > 1 && tagLine[0] == 'T') {
    // Use the branch specified in the tag file.
    std::string flag = cmStrCat("-r", cm::string_view(tagLine).substr(1));
    return flag;
  }
  // Use the default branch.
  return "-b";
}